

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnMemory
          (BinaryReaderIR *this,Index index,Limits *page_limits)

{
  uint64_t uVar1;
  bool bVar2;
  Location local_58;
  MemoryModuleField *local_38;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_30;
  
  GetLocation(&local_58,this);
  MakeUnique<wabt::MemoryModuleField,wabt::Location>((wabt *)&local_38,&local_58);
  bVar2 = page_limits->is_shared;
  (local_38->memory).page_limits.has_max = page_limits->has_max;
  (local_38->memory).page_limits.is_shared = bVar2;
  uVar1 = page_limits->max;
  (local_38->memory).page_limits.initial = page_limits->initial;
  (local_38->memory).page_limits.max = uVar1;
  local_30._M_head_impl = local_38;
  local_38 = (MemoryModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                       *)&local_30);
  if (local_30._M_head_impl != (MemoryModuleField *)0x0) {
    (*((local_30._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_30._M_head_impl = (MemoryModuleField *)0x0;
  if (local_38 != (MemoryModuleField *)0x0) {
    (**(code **)(*(long *)local_38 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnMemory(Index index, const Limits* page_limits) {
  auto field = MakeUnique<MemoryModuleField>(GetLocation());
  Memory& memory = field->memory;
  memory.page_limits = *page_limits;
  module_->AppendField(std::move(field));
  return Result::Ok;
}